

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  cmGeneratorTarget *this_00;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var1;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  mapped_type *pmVar5;
  string *obj;
  pointer this_01;
  string_view separator;
  cmAlphaNum local_130;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_100;
  string value;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  cmAlphaNum local_a0;
  string dest;
  string local_50;
  
  if (itgen != (cmInstallTargetGenerator *)0x0) {
    bVar3 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config);
    if (bVar3) {
      this_00 = itgen->Target;
      local_100 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)importedLocations;
      cmInstallTargetGenerator::GetDestination(&dest,itgen,config);
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      bVar3 = cmsys::SystemTools::FileIsFullPath(&dest);
      if (!bVar3) {
        std::__cxx11::string::assign((char *)&value);
      }
      std::__cxx11::string::append((string *)&value);
      std::__cxx11::string::append((char *)&value);
      if (itgen->ImportLibrary == true) {
        local_130.View_._M_len = 0xf;
        local_130.View_._M_str = "IMPORTED_IMPLIB";
        local_a0.View_._M_str = (suffix->_M_dataplus)._M_p;
        local_a0.View_._M_len = suffix->_M_string_length;
        cmStrCat<>(&prop,&local_130,&local_a0);
        cmInstallTargetGenerator::GetInstallFilename((string *)&local_130,this_00,config,NameImplib)
        ;
        p_Var1 = local_100;
        std::__cxx11::string::append((string *)&value);
        std::__cxx11::string::~string((string *)&local_130);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prop);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(p_Var1,&prop);
      }
      else {
        TVar4 = cmGeneratorTarget::GetType(itgen->Target);
        if (TVar4 == OBJECT_LIBRARY) {
          local_130.View_._M_len = (size_t)&DAT_00000010;
          local_130.View_._M_str = "IMPORTED_OBJECTS";
          local_a0.View_._M_str = (suffix->_M_dataplus)._M_p;
          local_a0.View_._M_len = suffix->_M_string_length;
          cmStrCat<>(&prop,&local_130,&local_a0);
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmInstallTargetGenerator::GetInstallObjectNames(itgen,config,&objects);
          pbVar2 = objects.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = objects.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar2;
              this_01 = this_01 + 1) {
            local_130.View_._M_len = value._M_string_length;
            local_130.View_._M_str = value._M_dataplus._M_p;
            local_a0.View_._M_str = (this_01->_M_dataplus)._M_p;
            local_a0.View_._M_len = this_01->_M_string_length;
            cmStrCat<>(&local_50,&local_130,&local_a0);
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin((string *)&local_130,&objects,separator,(string_view)ZEXT816(0));
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_100,&prop);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&objects);
        }
        else {
          local_130.View_._M_len = (size_t)&DAT_00000011;
          local_130.View_._M_str = "IMPORTED_LOCATION";
          local_a0.View_._M_str = (suffix->_M_dataplus)._M_p;
          local_a0.View_._M_len = suffix->_M_string_length;
          cmStrCat<>(&prop,&local_130,&local_a0);
          p_Var1 = local_100;
          bVar3 = cmGeneratorTarget::IsAppBundleOnApple(this_00);
          if (bVar3) {
            cmInstallTargetGenerator::GetInstallFilename
                      ((string *)&local_130,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::append((char *)&value);
            bVar3 = cmMakefile::PlatformIsAppleEmbedded(this_00->Makefile);
            if (!bVar3) {
              std::__cxx11::string::append((char *)&value);
            }
            cmInstallTargetGenerator::GetInstallFilename
                      ((string *)&local_130,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
          }
          else {
            cmInstallTargetGenerator::GetInstallFilename
                      ((string *)&local_130,this_00,config,NameReal);
            std::__cxx11::string::append((string *)&value);
          }
          std::__cxx11::string::~string((string *)&local_130);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(p_Var1,&prop);
        }
      }
      std::__cxx11::string::~string((string *)&prop);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&dest);
    }
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest)) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);

    // Append the installed file name.
    value += cmInstallTargetGenerator::GetInstallFilename(
      target, config, cmInstallTargetGenerator::NameImplib);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::string& obj : objects) {
      obj = cmStrCat(value, obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
    importedLocations.insert(prop);
  } else {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
      value += ".app/";
      if (!target->Makefile->PlatformIsAppleEmbedded()) {
        value += "Contents/MacOS/";
      }
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
    } else {
      value += cmInstallTargetGenerator::GetInstallFilename(
        target, config, cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}